

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_alphamapblit_generic
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  DestFetchProc64 p_Var2;
  DestStoreProc64 p_Var3;
  QT_FT_Span *pQVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  QColorTrcLut *colorProfile;
  QRgba64 *pQVar8;
  ulong uVar9;
  ClipLine *pCVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int len;
  int iVar16;
  long in_FS_OFFSET;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  QRgba64 buffer [2048];
  uchar *local_4098;
  QRgba64 local_4080;
  QRgba64 local_4038 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)((long)&color->rgba + 6) != 0) {
    if (useGammaCorrection) {
      colorProfile = QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate::self);
    }
    else {
      colorProfile = (QColorTrcLut *)0x0;
    }
    local_4080 = (QRgba64)color->rgba;
    uVar17 = (ushort)(local_4080.rgba >> 0x30);
    if (uVar17 == 0xffff && colorProfile != (QColorTrcLut *)0x0) {
      _Var1._M_head_impl =
           (colorProfile->m_toLinear)._M_t.
           super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
           super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      uVar18 = (ushort)(local_4080.rgba >> 0x10);
      uVar19 = (ushort)(local_4080.rgba >> 0x20);
      uVar17 = uVar17 - (uVar17 >> 8);
      local_4080.rgba =
           CONCAT26((uVar17 >> 8) + uVar17,
                    CONCAT24((_Var1._M_head_impl[(ushort)(uVar19 - (uVar19 >> 8)) >> 4] >> 8) +
                             _Var1._M_head_impl[(ushort)(uVar19 - (uVar19 >> 8)) >> 4],
                             CONCAT22((_Var1._M_head_impl[(ushort)(uVar18 - (uVar18 >> 8)) >> 4] >>
                                      8) + _Var1._M_head_impl[(ushort)(uVar18 - (uVar18 >> 8)) >> 4]
                                      ,(_Var1._M_head_impl
                                        [(ushort)((ushort)local_4080.rgba -
                                                 ((ushort)local_4080.rgba >> 8)) >> 4] >> 8) +
                                       _Var1._M_head_impl
                                       [(ushort)((ushort)local_4080.rgba -
                                                ((ushort)local_4080.rgba >> 8)) >> 4])));
    }
    p_Var2 = destFetchProc64[rasterBuffer->format];
    p_Var3 = destStoreProc64[rasterBuffer->format];
    if (clip == (QClipData *)0x0) {
      if (0 < mapHeight) {
        iVar7 = 0;
        local_4098 = map;
        do {
          if (0 < mapWidth) {
            iVar13 = x;
            iVar16 = mapWidth;
            do {
              len = 0x800;
              if (iVar16 < 0x800) {
                len = iVar16;
              }
              pQVar8 = (*p_Var2)(local_4038,rasterBuffer,iVar13,iVar7 + y,len);
              qt_alphamapblit_generic_oneline
                        (local_4098 + ((long)iVar13 - (long)x),len,local_4080,pQVar8,
                         (QRgba64)color->rgba,colorProfile);
              if (p_Var3 != (DestStoreProc64)0x0) {
                (*p_Var3)(rasterBuffer,iVar13,iVar7 + y,pQVar8,len);
              }
              iVar13 = iVar13 + len;
              iVar14 = iVar16 - len;
              bVar5 = len <= iVar16;
              iVar16 = iVar14;
            } while (iVar14 != 0 && bVar5);
          }
          local_4098 = local_4098 + mapStride;
          iVar7 = iVar7 + 1;
        } while (iVar7 != mapHeight);
      }
    }
    else {
      uVar6 = mapHeight + y;
      if (rasterBuffer->m_height <= mapHeight + y) {
        uVar6 = rasterBuffer->m_height;
      }
      uVar12 = 0;
      if (0 < y) {
        uVar12 = y;
      }
      QClipData::initialize(clip);
      if ((int)uVar12 < (int)uVar6) {
        uVar9 = (ulong)uVar12;
        local_4098 = map + (int)((uVar12 - y) * mapStride);
        do {
          if (0 < clip->m_clipLines[uVar9].count) {
            pCVar10 = clip->m_clipLines + uVar9;
            lVar15 = 8;
            lVar11 = 0;
            do {
              pQVar4 = pCVar10->spans;
              iVar7 = *(int *)((long)pQVar4 + lVar15 + -8);
              iVar13 = x;
              if (x < iVar7) {
                iVar13 = iVar7;
              }
              iVar7 = iVar7 + *(int *)((long)pQVar4 + lVar15 + -4);
              iVar16 = mapWidth + x;
              if (iVar7 <= mapWidth + x) {
                iVar16 = iVar7;
              }
              iVar7 = iVar16 - iVar13;
              if (iVar7 != 0 && iVar13 <= iVar16) {
                pQVar8 = (*p_Var2)(local_4038,rasterBuffer,iVar13,
                                   *(int *)((long)&pQVar4->x + lVar15),iVar7);
                qt_alphamapblit_generic_oneline
                          (local_4098 + ((long)iVar13 - (long)x),iVar7,local_4080,pQVar8,
                           (QRgba64)color->rgba,colorProfile);
                if (p_Var3 != (DestStoreProc64)0x0) {
                  (*p_Var3)(rasterBuffer,iVar13,*(int *)((long)&pQVar4->x + lVar15),pQVar8,iVar7);
                }
              }
              lVar11 = lVar11 + 1;
              lVar15 = lVar15 + 0x10;
            } while (lVar11 < pCVar10->count);
          }
          local_4098 = local_4098 + mapStride;
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_generic(QRasterBuffer *rasterBuffer,
                                    int x, int y, const QRgba64 &color,
                                    const uchar *map,
                                    int mapWidth, int mapHeight, int mapStride,
                                    const QClipData *clip, bool useGammaCorrection)
{
    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    if (!clip) {
        for (int ly = 0; ly < mapHeight; ++ly) {
            int i = x;
            int length = mapWidth;
            while (length > 0) {
                int l = qMin(BufferSize, length);

                QRgba64 *dest = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                qt_alphamapblit_generic_oneline(map + i - x, l,
                                                srcColor, dest, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest, l);
                length -= l;
                i += l;
            }
            map += mapStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                if (end <= start)
                    continue;
                Q_ASSERT(end - start <= BufferSize);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, start, clip.y, end - start);
                qt_alphamapblit_generic_oneline(map + start - x, end - start,
                                                srcColor, dest, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, start, clip.y, dest, end - start);
            } // for (i -> line.count)
            map += mapStride;
        } // for (yp -> bottom)
    }
}